

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

void tree_insert(Node *root,int x,int y,int p,int q)

{
  bool bVar1;
  tNode *ptVar2;
  mapped_type *pmVar3;
  string *local_3f8;
  string local_320 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [32];
  undefined1 local_1e0;
  allocator local_1df;
  allocator local_1de;
  allocator local_1dd;
  allocator local_1dc;
  allocator local_1db;
  allocator local_1da;
  allocator local_1d9;
  allocator local_1d8;
  allocator local_1d7;
  allocator local_1d6;
  allocator local_1d5 [20];
  allocator local_1c1;
  string *local_1c0;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string asStack_38 [6];
  char local_32;
  char local_31;
  int local_30;
  char target;
  int iStack_2c;
  char source;
  int b;
  int a;
  Node next;
  int q_local;
  int p_local;
  int y_local;
  int x_local;
  Node *root_local;
  
  next._0_4_ = q;
  next._4_4_ = p;
  q_local = y;
  p_local = x;
  _y_local = root;
  ptVar2 = (tNode *)operator_new(0x140);
  tNode::tNode(ptVar2);
  for (iStack_2c = 0; iStack_2c < 0xc; iStack_2c = iStack_2c + 1) {
    for (local_30 = 0; local_30 < 0xc; local_30 = local_30 + 1) {
      ptVar2->board[iStack_2c][local_30] = (*_y_local)->board[iStack_2c][local_30];
    }
  }
  local_31 = ptVar2->board[p_local][q_local];
  local_32 = ptVar2->board[next._4_4_][(int)next];
  ptVar2->board[next._4_4_][(int)next] = local_31;
  ptVar2->board[p_local][q_local] = ' ';
  _b = ptVar2;
  bVar1 = is_repeat((Node *)&b);
  ptVar2 = _b;
  if (bVar1) {
    if (_b != (tNode *)0x0) {
      tNode::~tNode(_b);
      operator_delete(ptVar2);
    }
  }
  else {
    std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::operator=
              (&_b->materials,&(*_y_local)->materials);
    if (local_32 != ' ') {
      pmVar3 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
               operator[](&_b->materials,&local_32);
      *pmVar3 = *pmVar3 + -1;
    }
    std::__cxx11::string::operator=((string *)&_b->w_king_pos,(string *)&(*_y_local)->w_king_pos);
    std::__cxx11::string::operator=((string *)&_b->b_king_pos,(string *)&(*_y_local)->b_king_pos);
    _b->cur_side = (bool)(~(*_y_local)->cur_side & 1);
    local_1e0 = 1;
    local_1c0 = local_1b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"0",&local_1c1);
    local_1c0 = local_198;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"1",local_1d5);
    local_1c0 = local_178;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"2",&local_1d6);
    local_1c0 = local_158;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"3",&local_1d7);
    local_1c0 = local_138;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"4",&local_1d8);
    local_1c0 = local_118;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"5",&local_1d9);
    local_1c0 = local_f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"6",&local_1da);
    local_1c0 = local_d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"7",&local_1db);
    local_1c0 = local_b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"8",&local_1dc);
    local_1c0 = local_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"9",&local_1dd);
    local_1c0 = local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"10",&local_1de);
    local_1c0 = local_58;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"11",&local_1df);
    local_1e0 = 0;
    std::allocator<char>::~allocator((allocator<char> *)&local_1df);
    std::allocator<char>::~allocator((allocator<char> *)&local_1de);
    std::allocator<char>::~allocator((allocator<char> *)&local_1dd);
    std::allocator<char>::~allocator((allocator<char> *)&local_1dc);
    std::allocator<char>::~allocator((allocator<char> *)&local_1db);
    std::allocator<char>::~allocator((allocator<char> *)&local_1da);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d7);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d6);
    std::allocator<char>::~allocator((allocator<char> *)local_1d5);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    std::operator+((char *)local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(");
    std::operator+(local_300,(char *)local_320);
    std::operator+(local_2e0,local_300);
    std::operator+(local_2c0,(char *)local_2e0);
    std::operator+(local_2a0,(char *)local_2c0);
    std::operator+(local_280,(char *)local_2a0);
    std::operator+(local_260,local_280);
    std::operator+(local_240,(char *)local_260);
    std::operator+(local_220,local_240);
    std::operator+(local_200,(char *)local_220);
    std::__cxx11::string::operator=((string *)&_b->mv,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::string::~string((string *)local_240);
    std::__cxx11::string::~string((string *)local_260);
    std::__cxx11::string::~string((string *)local_280);
    std::__cxx11::string::~string((string *)local_2a0);
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::~string((string *)local_300);
    std::__cxx11::string::~string(local_320);
    std::vector<tNode_*,_std::allocator<tNode_*>_>::push_back(&(*_y_local)->next,(value_type *)&b);
    local_3f8 = asStack_38;
    do {
      local_3f8 = local_3f8 + -0x20;
      std::__cxx11::string::~string(local_3f8);
    } while (local_3f8 != local_1b8);
  }
  return;
}

Assistant:

void tree_insert(Node& root, int x, int y, int p, int q){

    Node next = new tNode;

    // Copying the current board state to the new board state
    int a, b;
    for(a=0; a<12; a++){
        for(b=0; b<12; b++){
            next->board[a][b] = root->board[a][b];
        }
    }

    // Moving the piece from (x,y) to (p,q), replacing if needed
    char source = next->board[x][y];
    char target = next->board[p][q];
    next->board[p][q] = source;
    next->board[x][y] = ' ';

    // Checks if this board state has already been examined; skips it if it has been examined
    if(!is_repeat(next)){

        next->materials = root->materials;
        if(' ' != target)
            next->materials[target] -= 1;

        // Copying attributes from old node to new node
        next->w_king_pos = root->w_king_pos;
        next->b_king_pos = root->b_king_pos;
        next->cur_side = !(root->cur_side);

        string conv_array[12] = {"0", "1", "2", "3", "4", "5", "6", "7", "8", "9", "10", "11"};
        next->mv = "(" + conv_array[x] +  "," + conv_array[y] + ")" + "->" + "(" + conv_array[p] +  "," + conv_array[q] + ")";

        root->next.push_back(next);
    }
    else{
        delete next;
    }
}